

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter>::
visit<slang::syntax::TypedefDeclarationSyntax&>
          (SyntaxVisitor<MultipleRewriter> *this,TypedefDeclarationSyntax *t)

{
  TypedefDeclarationSyntax *in_stack_00000280;
  MultipleRewriter *in_stack_00000288;
  
  CATCH2_INTERNAL_TEST_8()::MultipleRewriter::handle(slang::syntax::TypedefDeclarationSyntax_const__
            (in_stack_00000288,in_stack_00000280);
  return;
}

Assistant:

void visit(T&& t) {
        if constexpr (requires { DERIVED->handle(t); })
            DERIVED->handle(t);
        else
            DERIVED->visitDefault(t);
    }